

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O3

char * afm_stream_read_one(AFM_Stream stream)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  FT_Int FVar4;
  byte *pbVar5;
  
  afm_stream_skip_spaces(stream);
  if (stream->status < 1) {
    pbVar3 = stream->cursor + -1;
    FVar4 = 3;
    pbVar5 = stream->cursor;
    do {
      while( true ) {
        if (stream->limit <= pbVar5) goto LAB_0020a2d6;
        pbVar1 = pbVar5 + 1;
        stream->cursor = pbVar1;
        bVar2 = *pbVar5;
        pbVar5 = pbVar1;
        if (bVar2 < 0x1a) break;
        if (bVar2 == 0x1a) goto LAB_0020a2d6;
        if (bVar2 == 0x20) {
          return (char *)pbVar3;
        }
        if (bVar2 == 0x3b) {
          FVar4 = 1;
          goto LAB_0020a2d6;
        }
      }
      if (bVar2 == 9) {
        return (char *)pbVar3;
      }
    } while ((bVar2 != 10) && (bVar2 != 0xd));
    FVar4 = 2;
LAB_0020a2d6:
    stream->status = FVar4;
  }
  else {
    pbVar3 = (byte *)0x0;
  }
  return (char *)pbVar3;
}

Assistant:

static char*
  afm_stream_read_one( AFM_Stream  stream )
  {
    char*  str;


    afm_stream_skip_spaces( stream );
    if ( AFM_STATUS_EOC( stream ) )
      return NULL;

    str = AFM_STREAM_KEY_BEGIN( stream );

    while ( 1 )
    {
      int  ch = AFM_GETC();


      if ( AFM_IS_SPACE( ch ) )
        break;
      else if ( AFM_IS_NEWLINE( ch ) )
      {
        stream->status = AFM_STREAM_STATUS_EOL;
        break;
      }
      else if ( AFM_IS_SEP( ch ) )
      {
        stream->status = AFM_STREAM_STATUS_EOC;
        break;
      }
      else if ( AFM_IS_EOF( ch ) )
      {
        stream->status = AFM_STREAM_STATUS_EOF;
        break;
      }
    }

    return str;
  }